

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.h
# Opt level: O0

Expr * __thiscall
Program::makeExpr<AssignExpr,Expr*&,Expr*&>(Program *this,Expr **args,Expr **args_1)

{
  Expr *this_00;
  unique_ptr<AssignExpr,_std::default_delete<AssignExpr>_> *in_RDI;
  unique_ptr<Expr,_std::default_delete<Expr>_> *in_stack_ffffffffffffffc0;
  unique_ptr<Expr,_std::default_delete<Expr>_> *in_stack_ffffffffffffffc8;
  Program *in_stack_ffffffffffffffd0;
  Expr **in_stack_ffffffffffffffd8;
  unique_ptr<AssignExpr,_std::default_delete<AssignExpr>_> local_20 [4];
  
  std::make_unique<AssignExpr,Expr*&,Expr*&>
            (in_stack_ffffffffffffffd8,(Expr **)in_stack_ffffffffffffffd0);
  std::unique_ptr<Expr,std::default_delete<Expr>>::
  unique_ptr<AssignExpr,std::default_delete<AssignExpr>,void>(in_stack_ffffffffffffffc0,local_20);
  this_00 = addOwnership(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::unique_ptr<Expr,_std::default_delete<Expr>_>::~unique_ptr
            ((unique_ptr<Expr,_std::default_delete<Expr>_> *)this_00);
  std::unique_ptr<AssignExpr,_std::default_delete<AssignExpr>_>::~unique_ptr(in_RDI);
  return this_00;
}

Assistant:

Expr* makeExpr(Args&&... args) {
        return addOwnership(std::make_unique<T>(std::forward<Args>(args)...));
    }